

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

bool run_msgpack_example(void)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  code **ppcVar5;
  char cVar6;
  long lVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  any var2;
  any var;
  form form;
  stringstream ss;
  any local_278;
  any local_268;
  undefined1 local_258 [48];
  sub_form local_228;
  sub_form local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_208;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  code *local_1b8;
  undefined8 local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_268._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_268._M_storage._M_ptr = (void *)0x0;
  local_278._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_278._M_storage._M_ptr = (void *)0x0;
  local_208.first._M_dataplus._M_p = (pointer)&local_208.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"compact","");
  local_208.second._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_208.second._M_storage = (_Storage)0x1;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"schema","");
  local_1b8 = std::any::_Manager_internal<int>::_S_manage;
  local_1b0 = 0;
  __l._M_len = 2;
  __l._M_array = &local_208;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         *)local_258,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_228,(allocator_type *)&local_218);
  std::any::operator=(&local_268,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)local_258);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)local_258);
  lVar7 = -0x60;
  ppcVar5 = &local_1b8;
  do {
    if (*ppcVar5 != (code *)0x0) {
      (**ppcVar5)(3,ppcVar5,0);
      *ppcVar5 = (code *)0x0;
    }
    if (ppcVar5 + -2 != (code **)ppcVar5[-4]) {
      operator_delete(ppcVar5[-4],(ulong)(ppcVar5[-2] + 1));
    }
    ppcVar5 = ppcVar5 + -6;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0);
  goodform::msgpack::serialize(&local_268,local_198);
  goodform::msgpack::deserialize((istream *)local_1a8,&local_278);
  goodform::form::form((form *)&local_208,&local_278);
  pcVar1 = local_258 + 0x10;
  local_258._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"compact","");
  local_228 = goodform::sub_form::at((sub_form *)&local_208,(string *)local_258);
  local_218.error_._0_1_ = goodform::sub_form::boolean(&local_228);
  goodform::boolean_validator::val((boolean_validator *)&local_218);
  if ((pointer)local_258._0_8_ != pcVar1) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
  }
  local_258._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"schema","");
  local_218 = goodform::sub_form::at((sub_form *)&local_208,(string *)local_258);
  goodform::sub_form::int32(&local_228);
  iVar2 = (int)local_228.variant_;
  if ((pointer)local_258._0_8_ != pcVar1) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
  }
  bVar3 = goodform::form::is_good((form *)&local_208);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{ \"compact\": ",0xd);
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) | 1;
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", \"schema\": ",0xc);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," }",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    cVar6 = -0x60;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MsgPack Passed.",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  }
  else {
    cVar6 = '\x18';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MsgPack Passed.",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
  }
  std::ostream::put(cVar6);
  std::ostream::flush();
  if ((any *)local_208.first.field_2._M_allocated_capacity != &local_208.second) {
    operator_delete((void *)local_208.first.field_2._M_allocated_capacity,
                    (ulong)(local_208.second._M_manager + 1));
  }
  if (local_278._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_278._M_manager)(_Op_destroy,&local_278,(_Arg *)0x0);
  }
  if (local_268._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_268._M_manager)(_Op_destroy,&local_268,(_Arg *)0x0);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return bVar3;
}

Assistant:

bool run_msgpack_example()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"compact", true},
      {"schema", 0}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool compact;
    std::int32_t schema;
  } mpack;

  mpack.compact = form.at("compact").boolean().val();
  mpack.schema = form.at("schema").int32().val();

  if (form.is_good())
  {
    std::cout << "{ \"compact\": " << std::boolalpha << mpack.compact << ", \"schema\": " << mpack.schema << " }" << std::endl;
    std::cout << "MsgPack Passed." << std::endl;
    return true;
  }

  std::cerr << "MsgPack Passed." << std::endl;
  return false;
}